

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void launch_loop_filter_rows
               (AV1_COMMON *cm,EncWorkerData *thread_data,AV1EncRowMultiThreadInfo *enc_row_mt,
               int mib_size_log2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AV1LfMTInfo *pAVar5;
  undefined4 in_ECX;
  aom_internal_error_info *in_RDX;
  undefined8 unaff_RBX;
  AV1_DEBLOCKING_PARAMETERS *in_RSI;
  AV1_COMMON *in_RDI;
  int next_sb_row;
  int cur_sb_row;
  int lpf_opt_level;
  LFWorkerData *lf_data;
  pthread_mutex_t *enc_row_mt_mutex_;
  _Bool row_mt_exit;
  AV1LfMTInfo *cur_job_info;
  int sb_rows;
  AV1LfSync *lf_sync;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff78;
  undefined3 uVar6;
  uint in_stack_ffffffffffffff7c;
  int iVar7;
  AV1_COMMON *cm_00;
  pthread_mutex_t *__mutex;
  int in_stack_ffffffffffffffb0;
  loop_filter_thresh *plVar8;
  undefined4 in_stack_ffffffffffffffc0;
  
  plVar8 = in_RSI[0x1b].lfthr;
  iVar2 = get_sb_rows_in_frame(in_RDI);
  __mutex = (pthread_mutex_t *)in_RDX->jmp[0].__saved_mask.__val[0];
  while( true ) {
    pAVar5 = get_lf_job_info((AV1LfSync *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (pAVar5 == (AV1LfMTInfo *)0x0) {
      return;
    }
    cm_00 = *(AV1_COMMON **)(in_RSI + 0x1c);
    in_stack_ffffffffffffff40 = pAVar5->lpf_opt_level;
    iVar3 = pAVar5->mi_row >> ((byte)in_ECX & 0x1f);
    if (iVar2 + -1 < iVar3 + 1) {
      iVar4 = iVar2 + -1;
    }
    else {
      iVar4 = iVar3 + 1;
    }
    iVar7 = iVar4;
    pthread_mutex_lock(__mutex);
    while( true ) {
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c & 0xffffff;
      if ((in_RDX->jmp[0].field_0x44 & 1) == 0) {
        uVar6 = CONCAT12(1,(short)in_stack_ffffffffffffff7c);
        if ((in_RDI->tiles).cols <= *(int *)(in_RDX->jmp[0].__jmpbuf[7] + (long)iVar3 * 4)) {
          uVar6 = CONCAT12(*(int *)(in_RDX->jmp[0].__jmpbuf[7] + (long)iVar7 * 4) <
                           (in_RDI->tiles).cols,(short)in_stack_ffffffffffffff7c);
        }
        in_stack_ffffffffffffff7c = CONCAT13((char)((uint3)uVar6 >> 0x10),uVar6);
      }
      if ((char)(in_stack_ffffffffffffff7c >> 0x18) == '\0') break;
      pthread_cond_wait((pthread_cond_t *)in_RDX->jmp[0].__saved_mask.__val[1],__mutex);
    }
    bVar1 = in_RDX->jmp[0].field_0x44;
    pthread_mutex_unlock(__mutex);
    if ((bVar1 & 1) != 0) break;
    av1_thread_loop_filter_rows
              ((YV12_BUFFER_CONFIG *)&__mutex->__data,cm_00,
               (macroblockd_plane *)CONCAT44(in_stack_ffffffffffffff40,iVar3),
               (MACROBLOCKD *)CONCAT44(iVar7,iVar4),in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0,(int)plVar8,
               (AV1LfSync *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),in_RDX,in_RSI,
               (TX_SIZE *)in_RDI,(int)unaff_RBX);
  }
  return;
}

Assistant:

static void launch_loop_filter_rows(AV1_COMMON *cm, EncWorkerData *thread_data,
                                    AV1EncRowMultiThreadInfo *enc_row_mt,
                                    int mib_size_log2) {
  AV1LfSync *const lf_sync = (AV1LfSync *)thread_data->lf_sync;
  const int sb_rows = get_sb_rows_in_frame(cm);
  AV1LfMTInfo *cur_job_info;
  bool row_mt_exit = false;
  (void)enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif

  while ((cur_job_info = get_lf_job_info(lf_sync)) != NULL) {
    LFWorkerData *const lf_data = (LFWorkerData *)thread_data->lf_data;
    const int lpf_opt_level = cur_job_info->lpf_opt_level;
    (void)sb_rows;
#if CONFIG_MULTITHREAD
    const int cur_sb_row = cur_job_info->mi_row >> mib_size_log2;
    const int next_sb_row = AOMMIN(sb_rows - 1, cur_sb_row + 1);
    // Wait for current and next superblock row to finish encoding.
    pthread_mutex_lock(enc_row_mt_mutex_);
    while (!enc_row_mt->row_mt_exit &&
           (enc_row_mt->num_tile_cols_done[cur_sb_row] < cm->tiles.cols ||
            enc_row_mt->num_tile_cols_done[next_sb_row] < cm->tiles.cols)) {
      pthread_cond_wait(enc_row_mt->cond_, enc_row_mt_mutex_);
    }
    row_mt_exit = enc_row_mt->row_mt_exit;
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    if (row_mt_exit) return;

    av1_thread_loop_filter_rows(
        lf_data->frame_buffer, lf_data->cm, lf_data->planes, lf_data->xd,
        cur_job_info->mi_row, cur_job_info->plane, cur_job_info->dir,
        lpf_opt_level, lf_sync, &thread_data->error_info, lf_data->params_buf,
        lf_data->tx_buf, mib_size_log2);
  }
}